

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MethodOptions::~MethodOptions(MethodOptions *this)

{
  MethodOptions *this_local;
  
  ~MethodOptions(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

MethodOptions::~MethodOptions() {
  // @@protoc_insertion_point(destructor:google.protobuf.MethodOptions)
  SharedDtor(*this);
}